

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dieharder_file.cc
# Opt level: O3

void generate<trng::yarn5s>(size_t samples,unsigned_long seed)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  char *__s;
  size_t sVar4;
  ostream *poVar5;
  ulong uVar6;
  ulong uVar7;
  yarn5s r;
  char local_59;
  yarn5s local_58;
  
  trng::yarn5s::yarn5s(&local_58,(parameter_type *)trng::yarn5s::trng0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "#==================================================================\n",0x44);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"# generator ",0xc);
  __s = trng::yarn5s::name();
  if (__s == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x3500d0);
  }
  else {
    sVar4 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  seed = ",9);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,"#==================================================================\n",0x44);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"type: d\n",8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"count: ",7);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"numbit: ",8);
  iVar3 = trng::int_math::log2_ceil<int>(0x7fffa78e);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3);
  local_59 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_59,1);
  if (samples != 0) {
    do {
      uVar6 = (long)local_58.P.a[3] * (long)local_58.S.r[3] +
              (long)local_58.P.a[2] * (long)local_58.S.r[2] +
              (long)local_58.P.a[1] * (long)local_58.S.r[1] +
              (long)local_58.P.a[0] * (long)local_58.S.r[0];
      uVar7 = uVar6 + 0x8000b0e1c2e43c3e;
      if (uVar6 < 0x7fff4f1e3d1bc3c2) {
        uVar7 = uVar6;
      }
      uVar7 = (long)local_58.S.r[4] * (long)local_58.P.a[4] + uVar7;
      local_58.S.r[4] = local_58.S.r[3];
      local_58.S.r[3] = local_58.S.r[2];
      local_58.S.r[2] = local_58.S.r[1];
      local_58.S.r[1] = local_58.S.r[0];
      uVar7 = (uVar7 >> 0x1f) * -0x7fffa78f + uVar7;
      uVar7 = (uVar7 >> 0x1f) * -0x7fffa78f + uVar7;
      uVar2 = (uint)uVar7;
      local_58.S.r[0] = uVar2 + 0x80005871;
      if (uVar7 < 0x7fffa78f) {
        local_58.S.r[0] = uVar2;
      }
      if (local_58.S.r[0] == 0) {
        iVar3 = 0;
      }
      else {
        uVar7 = ((ulong)*(uint *)(trng::yarn5s::g + (ulong)(local_58.S.r[0] & 0xffff) * 4) *
                 (ulong)*(uint *)(trng::yarn5s::g + (long)(local_58.S.r[0] >> 0x10) * 4 + 0x40000)
                >> 0x1f) * -0x7fffa78f +
                (ulong)*(uint *)(trng::yarn5s::g + (ulong)(local_58.S.r[0] & 0xffff) * 4) *
                (ulong)*(uint *)(trng::yarn5s::g + (long)(local_58.S.r[0] >> 0x10) * 4 + 0x40000);
        uVar7 = (uVar7 >> 0x1f) * -0x7fffa78f + uVar7;
        iVar1 = (int)uVar7;
        iVar3 = iVar1 + -0x7fffa78f;
        if (uVar7 < 0x7fffa78f) {
          iVar3 = iVar1;
        }
      }
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar3);
      local_59 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_59,1);
      samples = samples - 1;
    } while (samples != 0);
  }
  return;
}

Assistant:

void generate(std::size_t samples, unsigned long seed) {
  R r;
  std::cout << "#==================================================================\n"
            << "# generator " << r.name() << "  seed = " << seed << "\n"
            << "#==================================================================\n"
            << "type: d\n"
            << "count: " << samples << "\n"
            << "numbit: " << trng::int_math::log2_ceil(r.max() - r.min()) << '\n';
  for (std::size_t j{0}; j < samples; ++j)
    std::cout << r() - r.min() << '\n';
}